

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O1

bool anon_unknown.dwarf_50ad5a::RenderTargetImpl::isActive(Uint64 id)

{
  Uint64 UVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  UVar1 = sf::Context::getActiveContextId();
  lVar2 = 0x2854d0;
  if ((anonymous_namespace)::RenderTargetImpl::contextRenderTargetMap._16_8_ != 0) {
    lVar2 = 0x2854d0;
    lVar3 = (anonymous_namespace)::RenderTargetImpl::contextRenderTargetMap._16_8_;
    do {
      bVar4 = *(ulong *)(lVar3 + 0x20) < UVar1;
      if (!bVar4) {
        lVar2 = lVar3;
      }
      lVar3 = *(long *)(lVar3 + 0x10 + (ulong)bVar4 * 8);
    } while (lVar3 != 0);
  }
  lVar3 = 0x2854d0;
  if ((lVar2 != 0x2854d0) && (lVar3 = 0x2854d0, *(ulong *)(lVar2 + 0x20) <= UVar1)) {
    lVar3 = lVar2;
  }
  if (lVar3 == 0x2854d0) {
    bVar4 = false;
  }
  else {
    bVar4 = *(Uint64 *)(lVar3 + 0x28) == id;
  }
  return bVar4;
}

Assistant:

bool isActive(sf::Uint64 id)
        {
            ContextRenderTargetMap::iterator iter = contextRenderTargetMap.find(sf::Context::getActiveContextId());

            if ((iter == contextRenderTargetMap.end()) || (iter->second != id))
                return false;

            return true;
        }